

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
          (ClockingDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token globalOrDefault,
          Token clocking,Token blockName,Token at,EventExpressionSyntax *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClocking,
          NamedBlockClauseSyntax *endBlockName)

{
  pointer ppMVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = clocking._0_8_;
  uVar5 = globalOrDefault._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingDeclaration,attributes);
  (this->globalOrDefault).kind = (short)uVar5;
  (this->globalOrDefault).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->globalOrDefault).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->globalOrDefault).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->globalOrDefault).info = globalOrDefault.info;
  (this->clocking).kind = (short)uVar7;
  (this->clocking).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->clocking).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->clocking).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->clocking).info = clocking.info;
  (this->blockName).kind = blockName.kind;
  (this->blockName).field_0x2 = blockName._2_1_;
  (this->blockName).numFlags = (NumericTokenFlags)blockName.numFlags.raw;
  (this->blockName).rawLen = blockName.rawLen;
  (this->blockName).info = blockName.info;
  (this->at).kind = at.kind;
  (this->at).field_0x2 = at._2_1_;
  (this->at).numFlags = (NumericTokenFlags)at.numFlags.raw;
  (this->at).rawLen = at.rawLen;
  (this->at).info = at.info;
  (this->event).ptr = event;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057dd50;
  (this->endClocking).kind = endClocking.kind;
  (this->endClocking).field_0x2 = endClocking._2_1_;
  (this->endClocking).numFlags = (NumericTokenFlags)endClocking.numFlags.raw;
  (this->endClocking).rawLen = endClocking.rawLen;
  (this->endClocking).info = endClocking.info;
  this->endBlockName = endBlockName;
  (event->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(ClockingDeclarationSyntax **)(*(long *)((long)ppMVar1 + lVar6) + 8) = this;
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token globalOrDefault, Token clocking, Token blockName, Token at, EventExpressionSyntax& event, Token semi, const SyntaxList<MemberSyntax>& items, Token endClocking, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClockingDeclaration, attributes), globalOrDefault(globalOrDefault), clocking(clocking), blockName(blockName), at(at), event(&event), semi(semi), items(items), endClocking(endClocking), endBlockName(endBlockName) {
        this->event->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }